

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

void __thiscall leveldb::RecoveryTest::RecoveryTest(RecoveryTest *this)

{
  Env *pEVar1;
  long *plVar2;
  long *plVar3;
  void *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  Options local_80;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__RecoveryTest_0017c338;
  (this->dbname_)._M_dataplus._M_p = (pointer)&(this->dbname_).field_2;
  (this->dbname_)._M_string_length = 0;
  (this->dbname_).field_2._M_local_buf[0] = '\0';
  pEVar1 = Env::Default();
  this->env_ = pEVar1;
  this->db_ = (DB *)0x0;
  testing::TempDir_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::append((char *)local_a0);
  plVar3 = plVar2 + 2;
  if ((Env **)*plVar2 == (Env **)plVar3) {
    local_80.env = (Env *)*plVar3;
    local_80.info_log = (Logger *)plVar2[3];
    local_80.comparator = (Comparator *)&local_80.env;
  }
  else {
    local_80.env = (Env *)*plVar3;
    local_80.comparator = (Comparator *)*plVar2;
  }
  local_80._8_8_ = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->dbname_,(string *)&local_80);
  if (local_80.comparator != (Comparator *)&local_80.env) {
    operator_delete(local_80.comparator);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  Options::Options(&local_80);
  DestroyDB((leveldb *)&local_a8,&this->dbname_,&local_80);
  if (local_a8 != (void *)0x0) {
    operator_delete__(local_a8);
  }
  Open(this,(Options *)0x0);
  return;
}

Assistant:

RecoveryTest() : env_(Env::Default()), db_(nullptr) {
    dbname_ = testing::TempDir() + "/recovery_test";
    DestroyDB(dbname_, Options());
    Open();
  }